

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IRBuilderAsmJs.cpp
# Opt level: O0

void __thiscall
IRBuilderAsmJs::BuildInt2
          (IRBuilderAsmJs *this,OpCodeAsmJs newOpcode,uint32 offset,RegSlot dstRegSlot,
          RegSlot srcRegSlot)

{
  code *pcVar1;
  bool bVar2;
  ValueType VVar3;
  RegOpnd *this_00;
  RegOpnd *this_01;
  IntConstOpnd *pIVar4;
  RegOpnd *src1Opnd;
  undefined4 *puVar5;
  Instr *local_48;
  Instr *instr;
  RegOpnd *dstOpnd;
  RegOpnd *srcOpnd;
  RegSlot srcRegSlot_local;
  RegSlot dstRegSlot_local;
  uint32 offset_local;
  OpCodeAsmJs newOpcode_local;
  IRBuilderAsmJs *this_local;
  
  this_00 = BuildSrcOpnd(this,srcRegSlot,TyInt32);
  VVar3 = ValueType::GetInt(false);
  IR::Opnd::SetValueType(&this_00->super_Opnd,VVar3);
  this_01 = BuildDstOpnd(this,dstRegSlot,TyInt32);
  VVar3 = ValueType::GetInt(false);
  IR::Opnd::SetValueType(&this_01->super_Opnd,VVar3);
  local_48 = (Instr *)0x0;
  if (newOpcode != Ld_Int) {
    if (newOpcode != BeginSwitch_Int) {
      if (newOpcode == Return_Int) {
        local_48 = IR::Instr::New(Ld_I4,&this_01->super_Opnd,&this_00->super_Opnd,this->m_func);
        CheckJitLoopReturn(this,dstRegSlot,TyInt32);
      }
      else if (newOpcode == I32Extend8_s) {
        local_48 = CreateSignExtendInstr(this,&this_01->super_Opnd,&this_00->super_Opnd,TyInt8);
      }
      else if (newOpcode == I32Extend16_s) {
        local_48 = CreateSignExtendInstr(this,&this_01->super_Opnd,&this_00->super_Opnd,TyInt16);
      }
      else if (newOpcode == Neg_Int) {
        local_48 = IR::Instr::New(Neg_I4,&this_01->super_Opnd,&this_00->super_Opnd,this->m_func);
      }
      else if (newOpcode == Not_Int) {
        local_48 = IR::Instr::New(Not_I4,&this_01->super_Opnd,&this_00->super_Opnd,this->m_func);
      }
      else if (newOpcode == LogNot_Int) {
        pIVar4 = IR::IntConstOpnd::New(0,TyInt32,this->m_func,false);
        local_48 = IR::Instr::New(CmEq_I4,&this_01->super_Opnd,&this_00->super_Opnd,
                                  &pIVar4->super_Opnd,this->m_func);
      }
      else if (newOpcode == Conv_ITB) {
        pIVar4 = IR::IntConstOpnd::New(0,TyInt32,this->m_func,false);
        local_48 = IR::Instr::New(CmNeq_I4,&this_01->super_Opnd,&this_00->super_Opnd,
                                  &pIVar4->super_Opnd,this->m_func);
      }
      else if (newOpcode == PopCnt_Int) {
        local_48 = IR::Instr::New(PopCnt,&this_01->super_Opnd,&this_00->super_Opnd,this->m_func);
      }
      else if (newOpcode == Eqz_Int) {
        pIVar4 = IR::IntConstOpnd::New(0,TyInt32,this->m_func,false);
        local_48 = IR::Instr::New(CmEq_I4,&this_01->super_Opnd,&this_00->super_Opnd,
                                  &pIVar4->super_Opnd,this->m_func);
      }
      else if (newOpcode == Abs_Int) {
        local_48 = IR::Instr::New(InlineMathAbs,&this_01->super_Opnd,&this_00->super_Opnd,
                                  this->m_func);
      }
      else if (newOpcode == Clz32_Int) {
        local_48 = IR::Instr::New(InlineMathClz,&this_01->super_Opnd,&this_00->super_Opnd,
                                  this->m_func);
      }
      else if (newOpcode == Ctz_Int) {
        local_48 = IR::Instr::New(Ctz,&this_01->super_Opnd,&this_00->super_Opnd,this->m_func);
      }
      else if (newOpcode == GrowMemory) {
        src1Opnd = BuildSrcOpnd(this,3,TyVar);
        local_48 = IR::Instr::New(GrowWasmMemory,&this_01->super_Opnd,&src1Opnd->super_Opnd,
                                  &this_00->super_Opnd,this->m_func);
      }
      else {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar5 = 1;
        bVar2 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IRBuilderAsmJs.cpp"
                           ,0x9c9,"((0))","(0)");
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar5 = 0;
      }
      goto LAB_0069526c;
    }
    SwitchIRBuilder::BeginSwitch(&this->m_switchBuilder);
  }
  local_48 = IR::Instr::New(Ld_I4,&this_01->super_Opnd,&this_00->super_Opnd,this->m_func);
LAB_0069526c:
  AddInstr(this,local_48,offset);
  if (newOpcode == GrowMemory) {
    BuildHeapBufferReload(this,offset,false);
  }
  return;
}

Assistant:

void
IRBuilderAsmJs::BuildInt2(Js::OpCodeAsmJs newOpcode, uint32 offset, Js::RegSlot dstRegSlot, Js::RegSlot srcRegSlot)
{
    IR::RegOpnd * srcOpnd = BuildSrcOpnd(srcRegSlot, TyInt32);
    srcOpnd->SetValueType(ValueType::GetInt(false));

    IR::RegOpnd * dstOpnd = BuildDstOpnd(dstRegSlot, TyInt32);
    dstOpnd->SetValueType(ValueType::GetInt(false));

    IR::Instr * instr = nullptr;
    switch (newOpcode)
    {
    case Js::OpCodeAsmJs::BeginSwitch_Int:
        m_switchBuilder.BeginSwitch();
        // fall-through
    case Js::OpCodeAsmJs::Ld_Int:
        instr = IR::Instr::New(Js::OpCode::Ld_I4, dstOpnd, srcOpnd, m_func);
        break;

    case Js::OpCodeAsmJs::Neg_Int:
        instr = IR::Instr::New(Js::OpCode::Neg_I4, dstOpnd, srcOpnd, m_func);
        break;

    case Js::OpCodeAsmJs::Not_Int:
        instr = IR::Instr::New(Js::OpCode::Not_I4, dstOpnd, srcOpnd, m_func);
        break;

    case Js::OpCodeAsmJs::LogNot_Int:
        instr = IR::Instr::New(Js::OpCode::CmEq_I4, dstOpnd, srcOpnd, IR::IntConstOpnd::New(0, TyInt32, m_func), m_func);
        break;

    case Js::OpCodeAsmJs::Conv_ITB:
        instr = IR::Instr::New(Js::OpCode::CmNeq_I4, dstOpnd, srcOpnd, IR::IntConstOpnd::New(0, TyInt32, m_func), m_func);
        break;

    case Js::OpCodeAsmJs::Abs_Int:
        instr = IR::Instr::New(Js::OpCode::InlineMathAbs, dstOpnd, srcOpnd, m_func);
        break;

    case Js::OpCodeAsmJs::Clz32_Int:
        instr = IR::Instr::New(Js::OpCode::InlineMathClz, dstOpnd, srcOpnd, m_func);
        break;

    case Js::OpCodeAsmJs::Ctz_Int:
        instr = IR::Instr::New(Js::OpCode::Ctz, dstOpnd, srcOpnd, m_func);
        break;

    case Js::OpCodeAsmJs::PopCnt_Int:
        instr = IR::Instr::New(Js::OpCode::PopCnt, dstOpnd, srcOpnd, m_func);
        break;

    case Js::OpCodeAsmJs::Return_Int:
        instr = IR::Instr::New(Js::OpCode::Ld_I4, dstOpnd, srcOpnd, m_func);
        CheckJitLoopReturn(dstRegSlot, TyInt32);
        break;

    case Js::OpCodeAsmJs::Eqz_Int:
        instr = IR::Instr::New(Js::OpCode::CmEq_I4, dstOpnd, srcOpnd, IR::IntConstOpnd::New(0, TyInt32, m_func), m_func);
        break;

    case Js::OpCodeAsmJs::GrowMemory:
        instr = IR::Instr::New(Js::OpCode::GrowWasmMemory, dstOpnd, BuildSrcOpnd(AsmJsRegSlots::WasmMemoryReg, TyVar), srcOpnd, m_func);
        break;

    case Js::OpCodeAsmJs::I32Extend8_s:
        instr = CreateSignExtendInstr(dstOpnd, srcOpnd, TyInt8);
        break;
    case Js::OpCodeAsmJs::I32Extend16_s:
        instr = CreateSignExtendInstr(dstOpnd, srcOpnd, TyInt16);
        break;
    default:
        Assume(UNREACHED);
    }

    AddInstr(instr, offset);

    if (newOpcode == Js::OpCodeAsmJs::GrowMemory)
    {
        BuildHeapBufferReload(offset);
    }
}